

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr.c
# Opt level: O3

int hintcmp(void *ai,void *aj)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  uVar1 = **aj;
  iVar3 = 1;
  uVar2 = **ai;
  if ((uVar1 > uVar2 || uVar2 == uVar1) && (iVar3 = -1, uVar1 <= uVar2)) {
    uVar1 = **(uint **)(*ai + 4);
    uVar2 = **(uint **)(*aj + 4);
    iVar3 = 1;
    if (uVar1 <= uVar2) {
      iVar3 = -(uint)(uVar1 < uVar2);
    }
  }
  return iVar3;
}

Assistant:

static int hintcmp(const void *ai, const void *aj) {
  Hint *i = *(Hint **)ai;
  Hint *j = *(Hint **)aj;
  return (i->depth > j->depth)
             ? 1
             : ((i->depth < j->depth)
                    ? -1
                    : ((i->rule->index > j->rule->index) ? 1 : ((i->rule->index < j->rule->index) ? -1 : 0)));
}